

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_genericmodel.cpp
# Opt level: O2

void __thiscall tst_GenericModel::dragDropTree(tst_GenericModel *this)

{
  long lVar1;
  char cVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  ModelTest *pMVar8;
  long lVar9;
  int j_1;
  int iVar10;
  int j_4;
  int j;
  QModelIndex *pQVar11;
  int i;
  uint uVar12;
  initializer_list<QModelIndex> args_00;
  initializer_list<QModelIndex> args_01;
  initializer_list<QModelIndex> args_02;
  value_type args;
  QModelIndex *local_380;
  anon_union_24_3_e3d07ef4_for_data local_378;
  QModelIndex local_350;
  GenericModel destination;
  GenericModel source;
  int local_304;
  QModelIndex local_300;
  undefined8 local_2e8;
  undefined8 local_2e0;
  undefined8 uStack_2d8;
  int local_2cc;
  QModelIndex local_2c8;
  ulong local_2b0;
  ulong local_2a8;
  undefined8 local_2a0;
  undefined8 local_298;
  undefined8 uStack_290;
  QModelIndex local_288;
  QModelIndex parIdx;
  QSignalSpy *columnSpies [2];
  QSignalSpy *rowSpies [2];
  QSignalSpy rowsAboutToBeInsertedSpy;
  QSignalSpy columnsAboutToBeInsertedSpy;
  QSignalSpy rowsInsertedSpy;
  QSignalSpy columnsInsertedSpy;
  
  GenericModel::GenericModel(&source,(QObject *)0x0);
  GenericModel::GenericModel(&destination,(QObject *)0x0);
  pMVar8 = (ModelTest *)operator_new(0x10);
  ModelTest::ModelTest(pMVar8,(QAbstractItemModel *)&source,(QObject *)&source);
  pMVar8 = (ModelTest *)operator_new(0x10);
  ModelTest::ModelTest(pMVar8,(QAbstractItemModel *)&destination,(QObject *)&destination);
  rowsAboutToBeInsertedSpy.super_QObject = (QObject)0xff;
  rowsAboutToBeInsertedSpy._1_7_ = 0xffffffffffffff;
  rowsAboutToBeInsertedSpy._8_8_ = 0;
  rowsAboutToBeInsertedSpy.super_QList<QList<QVariant>_>.d.d = (Data *)0x0;
  GenericModel::insertColumns((int)&source,0,(QModelIndex *)0x2);
  rowsAboutToBeInsertedSpy.super_QObject = (QObject)0xff;
  rowsAboutToBeInsertedSpy._1_7_ = 0xffffffffffffff;
  rowsAboutToBeInsertedSpy._8_8_ = 0;
  rowsAboutToBeInsertedSpy.super_QList<QList<QVariant>_>.d.d = (Data *)0x0;
  local_2cc = 0;
  GenericModel::insertRows((int)&source,0,(QModelIndex *)0x5);
  local_2b0 = 10;
  local_2a8 = 0;
  uVar12 = 0;
  while( true ) {
    rowsAboutToBeInsertedSpy.super_QObject = (QObject)0xff;
    rowsAboutToBeInsertedSpy._1_7_ = 0xffffffffffffff;
    rowsAboutToBeInsertedSpy._8_8_ = 0;
    rowsAboutToBeInsertedSpy.super_QList<QList<QVariant>_>.d.d = (Data *)0x0;
    iVar4 = GenericModel::rowCount((QModelIndex *)&source);
    if (iVar4 <= (int)uVar12) break;
    iVar4 = 0;
    while( true ) {
      rowsAboutToBeInsertedSpy.super_QObject = (QObject)0xff;
      rowsAboutToBeInsertedSpy._1_7_ = 0xffffffffffffff;
      rowsAboutToBeInsertedSpy._8_8_ = 0;
      rowsAboutToBeInsertedSpy.super_QList<QList<QVariant>_>.d.d = (Data *)0x0;
      iVar5 = GenericModel::columnCount((QModelIndex *)&source);
      iVar7 = (int)(QModelIndex *)&source;
      iVar6 = (int)&rowsInsertedSpy;
      iVar10 = (int)&rowsAboutToBeInsertedSpy;
      if (iVar5 <= iVar4) break;
      columnsAboutToBeInsertedSpy.super_QObject = (QObject)0xff;
      columnsAboutToBeInsertedSpy._1_7_ = 0xffffffffffffff;
      columnsAboutToBeInsertedSpy._8_8_ = 0;
      columnsAboutToBeInsertedSpy.super_QList<QList<QVariant>_>.d.d = (Data *)0x0;
      GenericModel::index(iVar6,iVar7,(QModelIndex *)(ulong)uVar12);
      QVariant::QVariant((QVariant *)&rowsAboutToBeInsertedSpy,(int)local_2a8 + iVar4);
      GenericModel::setData((QModelIndex *)&source,(QVariant *)&rowsInsertedSpy,iVar10);
      QVariant::~QVariant((QVariant *)&rowsAboutToBeInsertedSpy);
      columnsAboutToBeInsertedSpy.super_QObject = (QObject)0xff;
      columnsAboutToBeInsertedSpy._1_7_ = 0xffffffffffffff;
      columnsAboutToBeInsertedSpy._8_8_ = 0;
      columnsAboutToBeInsertedSpy.super_QList<QList<QVariant>_>.d.d = (Data *)0x0;
      GenericModel::index(iVar6,iVar7,(QModelIndex *)(ulong)uVar12);
      QVariant::QVariant((QVariant *)&rowsAboutToBeInsertedSpy,(int)local_2b0 + iVar4);
      GenericModel::setData((QModelIndex *)&source,(QVariant *)&rowsInsertedSpy,iVar10);
      QVariant::~QVariant((QVariant *)&rowsAboutToBeInsertedSpy);
      iVar4 = iVar4 + 1;
    }
    rowsAboutToBeInsertedSpy.super_QObject = (QObject)0xff;
    rowsAboutToBeInsertedSpy._1_7_ = 0xffffffffffffff;
    rowsAboutToBeInsertedSpy._8_8_ = 0;
    rowsAboutToBeInsertedSpy.super_QList<QList<QVariant>_>.d.d = (Data *)0x0;
    GenericModel::index(iVar6,iVar7,(QModelIndex *)(ulong)uVar12);
    GenericModel::insertColumns(iVar7,0,(QModelIndex *)0x2);
    GenericModel::insertRows(iVar7,0,(QModelIndex *)0x3);
    pQVar11 = (QModelIndex *)0x0;
    local_304 = local_2cc;
    while( true ) {
      iVar4 = GenericModel::rowCount((QModelIndex *)&source);
      if (iVar4 <= (int)pQVar11) break;
      iVar4 = local_304;
      for (iVar5 = 0; iVar6 = GenericModel::columnCount((QModelIndex *)&source), iVar5 < iVar6;
          iVar5 = iVar5 + 1) {
        GenericModel::index((int)&columnsAboutToBeInsertedSpy,iVar7,pQVar11);
        QVariant::QVariant((QVariant *)&rowsAboutToBeInsertedSpy,iVar4);
        GenericModel::setData
                  ((QModelIndex *)&source,(QVariant *)&columnsAboutToBeInsertedSpy,iVar10);
        QVariant::~QVariant((QVariant *)&rowsAboutToBeInsertedSpy);
        iVar4 = iVar4 + 10;
      }
      pQVar11 = (QModelIndex *)(ulong)((int)pQVar11 + 1);
      local_304 = local_304 + 1;
    }
    uVar12 = uVar12 + 1;
    local_2b0 = (ulong)((int)local_2b0 + 10);
    local_2a8 = (ulong)((int)local_2a8 + 10);
    local_2cc = local_2cc + 100;
  }
  QSignalSpy::QSignalSpy
            (&rowsAboutToBeInsertedSpy,(QObject *)&destination,
             "2rowsAboutToBeInserted(QModelIndex, int, int)");
  cVar2 = QTest::qVerify(rowsAboutToBeInsertedSpy.sig.d.size != 0,
                         "rowsAboutToBeInsertedSpy.isValid()","",
                         "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                         ,0xbad);
  if (cVar2 == '\0') goto LAB_0013d2de;
  QSignalSpy::QSignalSpy
            (&rowsInsertedSpy,(QObject *)&destination,"2rowsInserted(QModelIndex, int, int)");
  cVar2 = QTest::qVerify(rowsInsertedSpy.sig.d.size != 0,"rowsInsertedSpy.isValid()","",
                         "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                         ,0xbaf);
  if (cVar2 != '\0') {
    QSignalSpy::QSignalSpy
              (&columnsAboutToBeInsertedSpy,(QObject *)&destination,
               "2columnsAboutToBeInserted(QModelIndex, int, int)");
    cVar2 = QTest::qVerify(columnsAboutToBeInsertedSpy.sig.d.size != 0,
                           "columnsAboutToBeInsertedSpy.isValid()","",
                           "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                           ,0xbb1);
    if (cVar2 != '\0') {
      QSignalSpy::QSignalSpy
                (&columnsInsertedSpy,(QObject *)&destination,
                 "2columnsInserted(QModelIndex, int, int)");
      args.d.d = (Data *)0xffffffffffffffff;
      args.d.ptr = (QVariant *)0x0;
      args.d.size = 0;
      columnSpies[0] = &columnsAboutToBeInsertedSpy;
      columnSpies[1] = &columnsInsertedSpy;
      rowSpies[0] = &rowsAboutToBeInsertedSpy;
      rowSpies[1] = &rowsInsertedSpy;
      GenericModel::index((int)&parIdx,(int)&source,(QModelIndex *)0x1);
      local_350.r = -1;
      local_350.c = -1;
      local_350.i = 0;
      local_350.m = (QAbstractItemModel *)0x0;
      GenericModel::index((int)&local_378,(int)&source,(QModelIndex *)0x0);
      args_00._M_len = 1;
      args_00._M_array = (iterator)&local_378;
      QList<QModelIndex>::QList((QList<QModelIndex> *)&args,args_00);
      lVar9 = GenericModel::mimeData((QList *)&source);
      QArrayDataPointer<QModelIndex>::~QArrayDataPointer((QArrayDataPointer<QModelIndex> *)&args);
      cVar2 = QTest::qVerify(lVar9 != 0,"mimeData","",
                             "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                             ,3000);
      if (cVar2 != '\0') {
        args.d.d = (Data *)0xffffffffffffffff;
        args.d.ptr = (QVariant *)0x0;
        args.d.size = 0;
        bVar3 = (bool)GenericModel::dropMimeData
                                ((QMimeData *)&destination,(DropAction)lVar9,1,0,(QModelIndex *)0x0)
        ;
        cVar2 = QTest::qVerify(bVar3,
                               "destination.dropMimeData(mimeData, Qt::CopyAction, 0, 0, QModelIndex())"
                               ,"",
                               "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                               ,0xbb9);
        if (cVar2 != '\0') {
          args.d.d = (Data *)0xffffffffffffffff;
          args.d.ptr = (QVariant *)0x0;
          args.d.size = 0;
          iVar4 = GenericModel::rowCount((QModelIndex *)&destination);
          cVar2 = QTest::qCompare(iVar4,1,"destination.rowCount()","1",
                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                  ,0xbba);
          if (cVar2 != '\0') {
            args.d.d = (Data *)0xffffffffffffffff;
            args.d.ptr = (QVariant *)0x0;
            args.d.size = 0;
            iVar4 = GenericModel::columnCount((QModelIndex *)&destination);
            cVar2 = QTest::qCompare(iVar4,1,"destination.columnCount()","1",
                                    "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                    ,0xbbb);
            if (cVar2 != '\0') {
              local_378._forAlignment = -NAN;
              local_378._8_8_ = 0;
              local_378._16_8_ = (QAbstractItemModel *)0x0;
              GenericModel::index((int)&args,(int)&destination,(QModelIndex *)0x0);
              iVar4 = GenericModel::rowCount((QModelIndex *)&destination);
              local_2e8 = 0xffffffffffffffff;
              local_2e0 = 0;
              uStack_2d8 = 0;
              GenericModel::index((int)&local_350,(int)&source,(QModelIndex *)0x0);
              iVar5 = GenericModel::rowCount((QModelIndex *)&source);
              cVar2 = QTest::qCompare(iVar4,iVar5,"destination.rowCount(destination.index(0, 0))",
                                      "source.rowCount(source.index(0, 0))",
                                      "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                      ,0xbbc);
              if (cVar2 != '\0') {
                local_378._forAlignment = -NAN;
                local_378._8_8_ = 0;
                local_378._16_8_ = (QAbstractItemModel *)0x0;
                GenericModel::index((int)&args,(int)&destination,(QModelIndex *)0x0);
                iVar4 = GenericModel::columnCount((QModelIndex *)&destination);
                local_2e8 = 0xffffffffffffffff;
                local_2e0 = 0;
                uStack_2d8 = 0;
                GenericModel::index((int)&local_350,(int)&source,(QModelIndex *)0x0);
                iVar5 = GenericModel::columnCount((QModelIndex *)&source);
                cVar2 = QTest::qCompare(iVar4,iVar5,
                                        "destination.columnCount(destination.index(0, 0))",
                                        "source.columnCount(source.index(0, 0))",
                                        "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                        ,0xbbd);
                if (cVar2 != '\0') {
                  uVar12 = 0;
                  while( true ) {
                    local_378._forAlignment = -NAN;
                    local_378._8_8_ = 0;
                    local_378._16_8_ = (QAbstractItemModel *)0x0;
                    iVar5 = (int)(QModelIndex *)&destination;
                    iVar10 = (int)(QVariant *)&args;
                    GenericModel::index(iVar10,iVar5,(QModelIndex *)0x0);
                    iVar4 = GenericModel::rowCount((QModelIndex *)&destination);
                    if (iVar4 <= (int)uVar12) break;
                    iVar4 = 0;
                    while( true ) {
                      local_378._forAlignment = -NAN;
                      local_378._8_8_ = 0;
                      local_378._16_8_ = (QAbstractItemModel *)0x0;
                      GenericModel::index(iVar10,iVar5,(QModelIndex *)0x0);
                      iVar7 = GenericModel::columnCount((QModelIndex *)&destination);
                      if (iVar7 <= iVar4) break;
                      local_300.r = -1;
                      local_300.c = -1;
                      local_300.i = 0;
                      local_300.m = (QAbstractItemModel *)0x0;
                      GenericModel::index((int)&local_2e8,iVar5,(QModelIndex *)0x0);
                      GenericModel::index((int)&local_350,iVar5,(QModelIndex *)(ulong)uVar12);
                      QModelIndex::data((QVariant *)&args,&local_350,0);
                      iVar7 = QVariant::toInt((bool *)&args);
                      local_2a0 = 0xffffffffffffffff;
                      local_298 = 0;
                      uStack_290 = 0;
                      GenericModel::index((int)&local_288,(int)&source,(QModelIndex *)0x0);
                      GenericModel::index((int)&local_2c8,(int)&source,(QModelIndex *)(ulong)uVar12)
                      ;
                      QModelIndex::data((QVariant *)&local_378,&local_2c8,0);
                      iVar6 = QVariant::toInt((bool *)local_378.data);
                      cVar2 = QTest::qCompare(iVar7,iVar6,
                                              "destination.index(i, j, destination.index(0, 0)).data().toInt()"
                                              ,
                                              "source.index(i, j, source.index(0, 0)).data().toInt()"
                                              ,
                                              "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                              ,0xbc0);
                      QVariant::~QVariant((QVariant *)&local_378);
                      QVariant::~QVariant((QVariant *)&args);
                      if (cVar2 == '\0') goto LAB_0013d2b7;
                      local_300.r = -1;
                      local_300.c = -1;
                      local_300.i = 0;
                      local_300.m = (QAbstractItemModel *)0x0;
                      GenericModel::index((int)&local_2e8,iVar5,(QModelIndex *)0x0);
                      GenericModel::index((int)&local_350,iVar5,(QModelIndex *)(ulong)uVar12);
                      QModelIndex::data((QVariant *)&args,&local_350,0x100);
                      iVar7 = QVariant::toInt((bool *)&args);
                      local_2a0 = 0xffffffffffffffff;
                      local_298 = 0;
                      uStack_290 = 0;
                      GenericModel::index((int)&local_288,(int)&source,(QModelIndex *)0x0);
                      GenericModel::index((int)&local_2c8,(int)&source,(QModelIndex *)(ulong)uVar12)
                      ;
                      QModelIndex::data((QVariant *)&local_378,&local_2c8,0x100);
                      iVar6 = QVariant::toInt((bool *)local_378.data);
                      cVar2 = QTest::qCompare(iVar7,iVar6,
                                              "destination.index(i, j, destination.index(0, 0)).data(Qt::UserRole).toInt()"
                                              ,
                                              "source.index(i, j, source.index(0, 0)).data(Qt::UserRole).toInt()"
                                              ,
                                              "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                              ,0xbc2);
                      QVariant::~QVariant((QVariant *)&local_378);
                      QVariant::~QVariant((QVariant *)&args);
                      iVar4 = iVar4 + 1;
                      if (cVar2 == '\0') goto LAB_0013d2b7;
                    }
                    uVar12 = uVar12 + 1;
                  }
                  local_2e8 = 0xffffffffffffffff;
                  local_2e0 = 0;
                  uStack_2d8 = 0;
                  GenericModel::index((int)&local_350,(int)&destination,(QModelIndex *)0x0);
                  QModelIndex::data((QVariant *)&args,&local_350,0);
                  iVar4 = QVariant::toInt((bool *)&args);
                  local_2c8.r = -1;
                  local_2c8.c = -1;
                  local_2c8.i = 0;
                  local_2c8.m = (QAbstractItemModel *)0x0;
                  GenericModel::index((int)&local_300,(int)&source,(QModelIndex *)0x0);
                  QModelIndex::data((QVariant *)&local_378,&local_300,0);
                  iVar5 = QVariant::toInt((bool *)local_378.data);
                  cVar2 = QTest::qCompare(iVar4,iVar5,"destination.index(0, 0).data().toInt()",
                                          "source.index(0, 0).data().toInt()",
                                          "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                          ,0xbc5);
                  QVariant::~QVariant((QVariant *)&local_378);
                  QVariant::~QVariant((QVariant *)&args);
                  if (cVar2 != '\0') {
                    local_2e8 = 0xffffffffffffffff;
                    local_2e0 = 0;
                    uStack_2d8 = 0;
                    GenericModel::index((int)&local_350,(int)&destination,(QModelIndex *)0x0);
                    QModelIndex::data((QVariant *)&args,&local_350,0x100);
                    iVar4 = QVariant::toInt((bool *)&args);
                    local_2c8.r = -1;
                    local_2c8.c = -1;
                    local_2c8.i = 0;
                    local_2c8.m = (QAbstractItemModel *)0x0;
                    GenericModel::index((int)&local_300,(int)&source,(QModelIndex *)0x0);
                    QModelIndex::data((QVariant *)&local_378,&local_300,0x100);
                    iVar5 = QVariant::toInt((bool *)local_378.data);
                    cVar2 = QTest::qCompare(iVar4,iVar5,
                                            "destination.index(0, 0).data(Qt::UserRole).toInt()",
                                            "source.index(0, 0).data(Qt::UserRole).toInt()",
                                            "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                            ,0xbc6);
                    QVariant::~QVariant((QVariant *)&local_378);
                    QVariant::~QVariant((QVariant *)&args);
                    if (cVar2 != '\0') {
                      lVar9 = 0;
                      do {
                        if (lVar9 == 0x10) {
                          lVar9 = 0;
                          goto LAB_0013c22b;
                        }
                        lVar1 = *(long *)((long)rowSpies + lVar9);
                        cVar2 = QTest::qCompare(*(longlong *)(lVar1 + 0x20),1,"spy->count()","1",
                                                "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                ,0xbc8);
                        if (cVar2 == '\0') break;
                        QList<QList<QVariant>_>::takeFirst
                                  ((value_type *)&args.d,(QList<QList<QVariant>_> *)(lVar1 + 0x10));
                        qvariant_cast<QModelIndex>((QModelIndex *)&local_378,args.d.ptr);
                        bVar3 = true;
                        if ((-1 < (int)local_378._0_4_) && (-1 < (long)local_378.shared)) {
                          bVar3 = (QAbstractItemModel *)local_378._16_8_ ==
                                  (QAbstractItemModel *)0x0;
                        }
                        cVar2 = QTest::qVerify(bVar3,"!args.at(0).value<QModelIndex>().isValid()",""
                                               ,
                                               "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                               ,0xbca);
                        if (cVar2 == '\0') goto LAB_0013d2ad;
                        iVar4 = QVariant::toInt((bool *)(args.d.ptr + 1));
                        cVar2 = QTest::qCompare(iVar4,0,"args.at(1).toInt()","0",
                                                "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                ,0xbcb);
                        if (cVar2 == '\0') goto LAB_0013d2ad;
                        iVar4 = QVariant::toInt((bool *)(args.d.ptr + 2));
                        cVar2 = QTest::qCompare(iVar4,0,"args.at(2).toInt()","0",
                                                "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                ,0xbcc);
                        QArrayDataPointer<QVariant>::~QArrayDataPointer(&args.d);
                        lVar9 = lVar9 + 8;
                      } while (cVar2 != '\0');
                    }
                  }
                }
              }
            }
          }
        }
      }
      goto LAB_0013d2b7;
    }
    goto LAB_0013d2c4;
  }
  goto LAB_0013d2d1;
LAB_0013c22b:
  if (lVar9 != 0x10) {
    lVar1 = *(long *)((long)columnSpies + lVar9);
    cVar2 = QTest::qCompare(*(longlong *)(lVar1 + 0x20),1,"spy->count()","1",
                            "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                            ,0xbcf);
    if (cVar2 != '\0') {
      QList<QList<QVariant>_>::takeFirst
                ((value_type *)&args.d,(QList<QList<QVariant>_> *)(lVar1 + 0x10));
      qvariant_cast<QModelIndex>((QModelIndex *)&local_378,args.d.ptr);
      bVar3 = true;
      if ((-1 < (int)local_378._0_4_) && (-1 < (long)local_378.shared)) {
        bVar3 = (QAbstractItemModel *)local_378._16_8_ == (QAbstractItemModel *)0x0;
      }
      cVar2 = QTest::qVerify(bVar3,"!args.at(0).value<QModelIndex>().isValid()","",
                             "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                             ,0xbd1);
      if (cVar2 != '\0') {
        iVar4 = QVariant::toInt((bool *)(args.d.ptr + 1));
        cVar2 = QTest::qCompare(iVar4,0,"args.at(1).toInt()","0",
                                "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                ,0xbd2);
        if (cVar2 != '\0') goto code_r0x0013c2fa;
      }
      goto LAB_0013d2ad;
    }
    goto LAB_0013d2b7;
  }
  QObject::deleteLater();
  local_378._16_8_ = parIdx.m;
  local_378.shared = (PrivateShared *)parIdx._0_8_;
  local_378._8_8_ = parIdx.i;
  args_01._M_len = 1;
  args_01._M_array = (iterator)&local_378;
  QList<QModelIndex>::QList((QList<QModelIndex> *)&args,args_01);
  lVar9 = GenericModel::mimeData((QList *)&source);
  QArrayDataPointer<QModelIndex>::~QArrayDataPointer((QArrayDataPointer<QModelIndex> *)&args);
  cVar2 = QTest::qVerify(lVar9 != 0,"mimeData","",
                         "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                         ,0xbd8);
  if (cVar2 == '\0') goto LAB_0013d2b7;
  local_378._forAlignment = -NAN;
  local_378._8_8_ = 0;
  local_378._16_8_ = (QAbstractItemModel *)0x0;
  GenericModel::index((int)&args,(int)&destination,(QModelIndex *)0x0);
  bVar3 = (bool)GenericModel::dropMimeData
                          ((QMimeData *)&destination,(DropAction)lVar9,1,0,(QModelIndex *)0x0);
  cVar2 = QTest::qVerify(bVar3,
                         "destination.dropMimeData(mimeData, Qt::CopyAction, 0, 0, destination.index(0, 0))"
                         ,"",
                         "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                         ,0xbd9);
  if (cVar2 == '\0') goto LAB_0013d2b7;
  args.d.d = (Data *)0xffffffffffffffff;
  args.d.ptr = (QVariant *)0x0;
  args.d.size = 0;
  iVar4 = GenericModel::rowCount((QModelIndex *)&destination);
  cVar2 = QTest::qCompare(iVar4,1,"destination.rowCount()","1",
                          "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                          ,0xbda);
  if (cVar2 == '\0') goto LAB_0013d2b7;
  args.d.d = (Data *)0xffffffffffffffff;
  args.d.ptr = (QVariant *)0x0;
  args.d.size = 0;
  iVar4 = GenericModel::columnCount((QModelIndex *)&destination);
  local_380 = (QModelIndex *)0x1;
  cVar2 = QTest::qCompare(iVar4,1,"destination.columnCount()","1",
                          "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                          ,0xbdb);
  if (cVar2 == '\0') goto LAB_0013d2b7;
  local_378._forAlignment = -NAN;
  local_378._8_8_ = 0;
  local_378._16_8_ = (QAbstractItemModel *)0x0;
  GenericModel::index((int)&args,(int)&destination,(QModelIndex *)0x0);
  iVar4 = GenericModel::rowCount((QModelIndex *)&destination);
  local_2e8 = 0xffffffffffffffff;
  local_2e0 = 0;
  uStack_2d8 = 0;
  GenericModel::index((int)&local_350,(int)&source,(QModelIndex *)0x0);
  iVar5 = GenericModel::rowCount((QModelIndex *)&source);
  cVar2 = QTest::qCompare(iVar4,iVar5 + 1,"destination.rowCount(destination.index(0, 0))",
                          "source.rowCount(source.index(0, 0)) + 1",
                          "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                          ,0xbdc);
  if (cVar2 == '\0') goto LAB_0013d2b7;
  local_378._forAlignment = -NAN;
  local_378._8_8_ = 0;
  local_378._16_8_ = (QAbstractItemModel *)0x0;
  GenericModel::index((int)&args,(int)&destination,(QModelIndex *)0x0);
  iVar4 = GenericModel::columnCount((QModelIndex *)&destination);
  local_2e8 = 0xffffffffffffffff;
  local_2e0 = 0;
  uStack_2d8 = 0;
  GenericModel::index((int)&local_350,(int)&source,(QModelIndex *)0x0);
  iVar5 = GenericModel::columnCount((QModelIndex *)&source);
  cVar2 = QTest::qCompare(iVar4,iVar5,"destination.columnCount(destination.index(0, 0))",
                          "source.columnCount(source.index(0, 0))",
                          "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                          ,0xbdd);
  if (cVar2 == '\0') goto LAB_0013d2b7;
  while( true ) {
    local_378._forAlignment = -NAN;
    local_378._8_8_ = 0;
    local_378._16_8_ = (QAbstractItemModel *)0x0;
    iVar5 = (int)(QModelIndex *)&destination;
    iVar10 = (int)(QVariant *)&args;
    GenericModel::index(iVar10,iVar5,(QModelIndex *)0x0);
    iVar4 = GenericModel::rowCount((QModelIndex *)&destination);
    if (iVar4 <= (int)local_380) break;
    iVar4 = 0;
    while( true ) {
      local_378._forAlignment = -NAN;
      local_378._8_8_ = 0;
      local_378._16_8_ = (QAbstractItemModel *)0x0;
      GenericModel::index(iVar10,iVar5,(QModelIndex *)0x0);
      iVar7 = GenericModel::columnCount((QModelIndex *)&destination);
      if (iVar7 <= iVar4) break;
      local_300.r = -1;
      local_300.c = -1;
      local_300.i = 0;
      local_300.m = (QAbstractItemModel *)0x0;
      GenericModel::index((int)&local_2e8,iVar5,(QModelIndex *)0x0);
      GenericModel::index((int)&local_350,iVar5,local_380);
      QModelIndex::data((QVariant *)&args,&local_350,0);
      iVar7 = QVariant::toInt((bool *)&args);
      local_2a0 = 0xffffffffffffffff;
      local_298 = 0;
      uStack_290 = 0;
      GenericModel::index((int)&local_288,(int)&source,(QModelIndex *)0x0);
      GenericModel::index((int)&local_2c8,(int)&source,(QModelIndex *)(ulong)((int)local_380 - 1U));
      QModelIndex::data((QVariant *)&local_378,&local_2c8,0);
      iVar6 = QVariant::toInt((bool *)local_378.data);
      cVar2 = QTest::qCompare(iVar7,iVar6,
                              "destination.index(i, j, destination.index(0, 0)).data().toInt()",
                              "source.index(i - 1, j, source.index(0, 0)).data().toInt()",
                              "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                              ,0xbe0);
      QVariant::~QVariant((QVariant *)&local_378);
      QVariant::~QVariant((QVariant *)&args);
      if (cVar2 == '\0') goto LAB_0013d2b7;
      local_300.r = -1;
      local_300.c = -1;
      local_300.i = 0;
      local_300.m = (QAbstractItemModel *)0x0;
      GenericModel::index((int)&local_2e8,iVar5,(QModelIndex *)0x0);
      GenericModel::index((int)&local_350,iVar5,local_380);
      QModelIndex::data((QVariant *)&args,&local_350,0x100);
      iVar7 = QVariant::toInt((bool *)&args);
      local_2a0 = 0xffffffffffffffff;
      local_298 = 0;
      uStack_290 = 0;
      GenericModel::index((int)&local_288,(int)&source,(QModelIndex *)0x0);
      GenericModel::index((int)&local_2c8,(int)&source,(QModelIndex *)(ulong)((int)local_380 - 1U));
      QModelIndex::data((QVariant *)&local_378,&local_2c8,0x100);
      iVar6 = QVariant::toInt((bool *)local_378.data);
      cVar2 = QTest::qCompare(iVar7,iVar6,
                              "destination.index(i, j, destination.index(0, 0)).data(Qt::UserRole).toInt()"
                              ,
                              "source.index(i - 1, j, source.index(0, 0)).data(Qt::UserRole).toInt()"
                              ,
                              "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                              ,0xbe2);
      QVariant::~QVariant((QVariant *)&local_378);
      QVariant::~QVariant((QVariant *)&args);
      iVar4 = iVar4 + 1;
      if (cVar2 == '\0') goto LAB_0013d2b7;
    }
    local_380 = (QModelIndex *)(ulong)((int)local_380 + 1);
  }
  local_350.r = -1;
  local_350.c = -1;
  local_350.i = 0;
  local_350.m = (QAbstractItemModel *)0x0;
  GenericModel::index((int)&local_378,(int)&destination,(QModelIndex *)0x0);
  GenericModel::index((int)&args,(int)&destination,(QModelIndex *)0x0);
  iVar4 = GenericModel::rowCount((QModelIndex *)&destination);
  iVar5 = GenericModel::rowCount((QModelIndex *)&source);
  cVar2 = QTest::qCompare(iVar4,iVar5,
                          "destination.rowCount(destination.index(0, 0, destination.index(0, 0)))",
                          "source.rowCount(parIdx)",
                          "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                          ,0xbe5);
  if (cVar2 == '\0') goto LAB_0013d2b7;
  local_350.r = -1;
  local_350.c = -1;
  local_350.i = 0;
  local_350.m = (QAbstractItemModel *)0x0;
  GenericModel::index((int)&local_378,(int)&destination,(QModelIndex *)0x0);
  GenericModel::index((int)&args,(int)&destination,(QModelIndex *)0x0);
  iVar4 = GenericModel::columnCount((QModelIndex *)&destination);
  iVar5 = GenericModel::columnCount((QModelIndex *)&source);
  cVar2 = QTest::qCompare(iVar4,iVar5,
                          "destination.columnCount(destination.index(0, 0, destination.index(0, 0)))"
                          ,"source.columnCount(parIdx)",
                          "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                          ,0xbe6);
  if (cVar2 != '\0') {
    uVar12 = 1;
    while( true ) {
      local_350.r = -1;
      local_350.c = -1;
      local_350.i = 0;
      local_350.m = (QAbstractItemModel *)0x0;
      iVar5 = (int)(QModelIndex *)&destination;
      GenericModel::index((int)&local_378,iVar5,(QModelIndex *)0x0);
      iVar10 = (int)(QVariant *)&args;
      GenericModel::index(iVar10,iVar5,(QModelIndex *)0x0);
      iVar4 = GenericModel::rowCount((QModelIndex *)&destination);
      if (iVar4 <= (int)uVar12) break;
      iVar4 = 0;
      while( true ) {
        local_350.r = -1;
        local_350.c = -1;
        local_350.i = 0;
        local_350.m = (QAbstractItemModel *)0x0;
        GenericModel::index((int)&local_378,iVar5,(QModelIndex *)0x0);
        GenericModel::index(iVar10,iVar5,(QModelIndex *)0x0);
        iVar7 = GenericModel::columnCount((QModelIndex *)&destination);
        if (iVar7 <= iVar4) break;
        local_2c8.r = -1;
        local_2c8.c = -1;
        local_2c8.i = 0;
        local_2c8.m = (QAbstractItemModel *)0x0;
        GenericModel::index((int)&local_300,iVar5,(QModelIndex *)0x0);
        GenericModel::index((int)&local_2e8,iVar5,(QModelIndex *)0x0);
        GenericModel::index((int)&local_350,iVar5,(QModelIndex *)(ulong)uVar12);
        QModelIndex::data((QVariant *)&args,&local_350,0);
        iVar7 = QVariant::toInt((bool *)&args);
        GenericModel::index((int)&local_288,(int)&source,(QModelIndex *)(ulong)uVar12);
        QModelIndex::data((QVariant *)&local_378,&local_288,0);
        iVar6 = QVariant::toInt((bool *)local_378.data);
        cVar2 = QTest::qCompare(iVar7,iVar6,
                                "destination.index(i, j, destination.index(0, 0, destination.index(0, 0))).data().toInt()"
                                ,"source.index(i, j, parIdx).data().toInt()",
                                "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                ,0xbea);
        QVariant::~QVariant((QVariant *)&local_378);
        QVariant::~QVariant((QVariant *)&args);
        if (cVar2 == '\0') goto LAB_0013d2b7;
        local_2c8.r = -1;
        local_2c8.c = -1;
        local_2c8.i = 0;
        local_2c8.m = (QAbstractItemModel *)0x0;
        GenericModel::index((int)&local_300,iVar5,(QModelIndex *)0x0);
        GenericModel::index((int)&local_2e8,iVar5,(QModelIndex *)0x0);
        GenericModel::index((int)&local_350,iVar5,(QModelIndex *)(ulong)uVar12);
        QModelIndex::data((QVariant *)&args,&local_350,0x100);
        iVar7 = QVariant::toInt((bool *)&args);
        GenericModel::index((int)&local_288,(int)&source,(QModelIndex *)(ulong)uVar12);
        QModelIndex::data((QVariant *)&local_378,&local_288,0x100);
        iVar6 = QVariant::toInt((bool *)local_378.data);
        cVar2 = QTest::qCompare(iVar7,iVar6,
                                "destination.index(i, j, destination.index(0, 0, destination.index(0, 0))).data(Qt::UserRole).toInt()"
                                ,"source.index(i, j, parIdx).data(Qt::UserRole).toInt()",
                                "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                ,0xbec);
        QVariant::~QVariant((QVariant *)&local_378);
        QVariant::~QVariant((QVariant *)&args);
        iVar4 = iVar4 + 1;
        if (cVar2 == '\0') goto LAB_0013d2b7;
      }
      uVar12 = uVar12 + 1;
    }
    lVar9 = 0;
    while( true ) {
      if (lVar9 == 0x10) {
        lVar9 = 0;
        goto LAB_0013ce4b;
      }
      lVar1 = *(long *)((long)rowSpies + lVar9);
      cVar2 = QTest::qCompare(*(longlong *)(lVar1 + 0x20),1,"spy->count()","1",
                              "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                              ,0xbf0);
      if (cVar2 == '\0') break;
      QList<QList<QVariant>_>::takeFirst(&args,(QList<QList<QVariant>_> *)(lVar1 + 0x10));
      qvariant_cast<QModelIndex>((QModelIndex *)&local_378,args.d.ptr);
      local_2e8 = 0xffffffffffffffff;
      local_2e0 = 0;
      uStack_2d8 = 0;
      GenericModel::index((int)&local_350,(int)&destination,(QModelIndex *)0x0);
      bVar3 = QTest::qCompare<QModelIndex,QModelIndex>
                        ((QModelIndex *)&local_378,&local_350,"args.at(0).value<QModelIndex>()",
                         "destination.index(0, 0)",
                         "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                         ,0xbf2);
      if (!bVar3) goto LAB_0013d2ad;
      iVar4 = QVariant::toInt((bool *)(args.d.ptr + 1));
      cVar2 = QTest::qCompare(iVar4,0,"args.at(1).toInt()","0",
                              "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                              ,0xbf3);
      if (cVar2 == '\0') goto LAB_0013d2ad;
      iVar4 = QVariant::toInt((bool *)(args.d.ptr + 2));
      cVar2 = QTest::qCompare(iVar4,0,"args.at(2).toInt()","0",
                              "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                              ,0xbf4);
      QArrayDataPointer<QVariant>::~QArrayDataPointer(&args.d);
      lVar9 = lVar9 + 8;
      if (cVar2 == '\0') break;
    }
  }
  goto LAB_0013d2b7;
code_r0x0013c2fa:
  iVar4 = QVariant::toInt((bool *)(args.d.ptr + 2));
  cVar2 = QTest::qCompare(iVar4,0,"args.at(2).toInt()","0",
                          "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                          ,0xbd3);
  QArrayDataPointer<QVariant>::~QArrayDataPointer(&args.d);
  lVar9 = lVar9 + 8;
  if (cVar2 == '\0') goto LAB_0013d2b7;
  goto LAB_0013c22b;
  while( true ) {
    cVar2 = QTest::qCompare(*(longlong *)(*(long *)((long)columnSpies + lVar9) + 0x20),0,
                            "spy->count()","0",
                            "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                            ,0xbf7);
    lVar9 = lVar9 + 8;
    if (cVar2 == '\0') break;
LAB_0013ce4b:
    if (lVar9 == 0x10) {
      QObject::deleteLater();
      GenericModel::index((int)&local_378,(int)&source,(QModelIndex *)0x1);
      args_02._M_len = 1;
      args_02._M_array = (iterator)&local_378;
      QList<QModelIndex>::QList((QList<QModelIndex> *)&args,args_02);
      lVar9 = GenericModel::mimeData((QList *)&source);
      QArrayDataPointer<QModelIndex>::~QArrayDataPointer((QArrayDataPointer<QModelIndex> *)&args);
      cVar2 = QTest::qVerify(lVar9 != 0,"mimeData","",
                             "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                             ,0xbfb);
      if (cVar2 != '\0') {
        args.d.d = (Data *)0xffffffffffffffff;
        args.d.ptr = (QVariant *)0x0;
        args.d.size = 0;
        bVar3 = (bool)GenericModel::dropMimeData
                                ((QMimeData *)&destination,(DropAction)lVar9,1,0,(QModelIndex *)0x0)
        ;
        cVar2 = QTest::qVerify(bVar3,
                               "destination.dropMimeData(mimeData, Qt::CopyAction, 0, 0, QModelIndex())"
                               ,"",
                               "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                               ,0xbfc);
        if (cVar2 != '\0') {
          args.d.d = (Data *)0xffffffffffffffff;
          args.d.ptr = (QVariant *)0x0;
          args.d.size = 0;
          iVar4 = GenericModel::rowCount((QModelIndex *)&destination);
          cVar2 = QTest::qCompare(iVar4,2,"destination.rowCount()","2",
                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                  ,0xbfd);
          if (cVar2 != '\0') {
            args.d.d = (Data *)0xffffffffffffffff;
            args.d.ptr = (QVariant *)0x0;
            args.d.size = 0;
            iVar4 = GenericModel::columnCount((QModelIndex *)&destination);
            cVar2 = QTest::qCompare(iVar4,1,"destination.columnCount()","1",
                                    "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                    ,0xbfe);
            if (cVar2 != '\0') {
              local_2e8 = 0xffffffffffffffff;
              local_2e0 = 0;
              uStack_2d8 = 0;
              GenericModel::index((int)&local_350,(int)&destination,(QModelIndex *)0x0);
              QModelIndex::data((QVariant *)&args,&local_350,0);
              iVar4 = QVariant::toInt((bool *)&args);
              GenericModel::index((int)&local_300,(int)&source,(QModelIndex *)0x1);
              QModelIndex::data((QVariant *)&local_378,&local_300,0);
              iVar5 = QVariant::toInt((bool *)local_378.data);
              cVar2 = QTest::qCompare(iVar4,iVar5,"destination.index(0, 0).data().toInt()",
                                      "source.index(1, 1, parIdx).data().toInt()",
                                      "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                      ,0xbff);
              QVariant::~QVariant((QVariant *)&local_378);
              QVariant::~QVariant((QVariant *)&args);
              if (cVar2 != '\0') {
                local_2e8 = 0xffffffffffffffff;
                local_2e0 = 0;
                uStack_2d8 = 0;
                GenericModel::index((int)&local_350,(int)&destination,(QModelIndex *)0x0);
                QModelIndex::data((QVariant *)&args,&local_350,0x100);
                iVar4 = QVariant::toInt((bool *)&args);
                GenericModel::index((int)&local_300,(int)&source,(QModelIndex *)0x1);
                QModelIndex::data((QVariant *)&local_378,&local_300,0x100);
                iVar5 = QVariant::toInt((bool *)local_378.data);
                cVar2 = QTest::qCompare(iVar4,iVar5,
                                        "destination.index(0, 0).data(Qt::UserRole).toInt()",
                                        "source.index(1, 1, parIdx).data(Qt::UserRole).toInt()",
                                        "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                        ,0xc00);
                QVariant::~QVariant((QVariant *)&local_378);
                QVariant::~QVariant((QVariant *)&args);
                if (cVar2 != '\0') {
                  lVar9 = 0;
                  goto LAB_0013d1a5;
                }
              }
            }
          }
        }
      }
      break;
    }
  }
  goto LAB_0013d2b7;
LAB_0013d1a5:
  if (lVar9 == 0x10) {
    lVar9 = 0;
    goto LAB_0013d32b;
  }
  lVar1 = *(long *)((long)rowSpies + lVar9);
  cVar2 = QTest::qCompare(*(longlong *)(lVar1 + 0x20),1,"spy->count()","1",
                          "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                          ,0xc02);
  if (cVar2 == '\0') goto LAB_0013d2b7;
  QList<QList<QVariant>_>::takeFirst
            ((value_type *)&args.d,(QList<QList<QVariant>_> *)(lVar1 + 0x10));
  qvariant_cast<QModelIndex>((QModelIndex *)&local_378,args.d.ptr);
  local_350.r = -1;
  local_350.c = -1;
  local_350.i = 0;
  local_350.m = (QAbstractItemModel *)0x0;
  bVar3 = QTest::qCompare<QModelIndex,QModelIndex>
                    ((QModelIndex *)&local_378,&local_350,"args.at(0).value<QModelIndex>()",
                     "QModelIndex()",
                     "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                     ,0xc04);
  if (!bVar3) goto LAB_0013d2ad;
  iVar4 = QVariant::toInt((bool *)(args.d.ptr + 1));
  cVar2 = QTest::qCompare(iVar4,0,"args.at(1).toInt()","0",
                          "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                          ,0xc05);
  if (cVar2 == '\0') goto LAB_0013d2ad;
  iVar4 = QVariant::toInt((bool *)(args.d.ptr + 2));
  cVar2 = QTest::qCompare(iVar4,0,"args.at(2).toInt()","0",
                          "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                          ,0xc06);
  QArrayDataPointer<QVariant>::~QArrayDataPointer(&args.d);
  lVar9 = lVar9 + 8;
  if (cVar2 == '\0') goto LAB_0013d2b7;
  goto LAB_0013d1a5;
LAB_0013d2ad:
  QArrayDataPointer<QVariant>::~QArrayDataPointer(&args.d);
  goto LAB_0013d2b7;
  while( true ) {
    cVar2 = QTest::qCompare(*(longlong *)(*(long *)((long)columnSpies + lVar9) + 0x20),0,
                            "spy->count()","0",
                            "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                            ,0xc09);
    lVar9 = lVar9 + 8;
    if (cVar2 == '\0') break;
LAB_0013d32b:
    if (lVar9 == 0x10) {
      QObject::deleteLater();
      break;
    }
  }
LAB_0013d2b7:
  QSignalSpy::~QSignalSpy(&columnsInsertedSpy);
LAB_0013d2c4:
  QSignalSpy::~QSignalSpy(&columnsAboutToBeInsertedSpy);
LAB_0013d2d1:
  QSignalSpy::~QSignalSpy(&rowsInsertedSpy);
LAB_0013d2de:
  QSignalSpy::~QSignalSpy(&rowsAboutToBeInsertedSpy);
  GenericModel::~GenericModel(&destination);
  GenericModel::~GenericModel(&source);
  return;
}

Assistant:

void tst_GenericModel::dragDropTree()
{
    GenericModel source;
    GenericModel destination;
    new ModelTest(&source, &source);
    new ModelTest(&destination, &destination);
    source.insertColumns(0, 2);
    source.insertRows(0, 5);
    for (int i = 0; i < source.rowCount(); ++i) {
        for (int j = 0; j < source.columnCount(); ++j) {
            source.setData(source.index(i, j), (10 * i) + j);
            source.setData(source.index(i, j), (10 * i) + j + 10, Qt::UserRole);
        }
        const QModelIndex parIdx = source.index(i, 0);
        source.insertColumns(0, 2, parIdx);
        source.insertRows(0, 3, parIdx);
        for (int k = 0; k < source.rowCount(parIdx); ++k) {
            for (int j = 0; j < source.columnCount(parIdx); ++j)
                source.setData(source.index(k, j, parIdx), (i * 100) + (10 * j) + k);
        }
    }
    QSignalSpy rowsAboutToBeInsertedSpy(&destination, SIGNAL(rowsAboutToBeInserted(QModelIndex, int, int)));
    QVERIFY(rowsAboutToBeInsertedSpy.isValid());
    QSignalSpy rowsInsertedSpy(&destination, SIGNAL(rowsInserted(QModelIndex, int, int)));
    QVERIFY(rowsInsertedSpy.isValid());
    QSignalSpy columnsAboutToBeInsertedSpy(&destination, SIGNAL(columnsAboutToBeInserted(QModelIndex, int, int)));
    QVERIFY(columnsAboutToBeInsertedSpy.isValid());
    QSignalSpy columnsInsertedSpy(&destination, SIGNAL(columnsInserted(QModelIndex, int, int)));
    QSignalSpy *rowSpies[] = {&rowsAboutToBeInsertedSpy, &rowsInsertedSpy};
    QSignalSpy *columnSpies[] = {&columnsAboutToBeInsertedSpy, &columnsInsertedSpy};
    const QModelIndex parIdx = source.index(1, 0);

    QMimeData *mimeData = source.mimeData({source.index(0, 0)});
    QVERIFY(mimeData);
    QVERIFY(destination.dropMimeData(mimeData, Qt::CopyAction, 0, 0, QModelIndex()));
    QCOMPARE(destination.rowCount(), 1);
    QCOMPARE(destination.columnCount(), 1);
    QCOMPARE(destination.rowCount(destination.index(0, 0)), source.rowCount(source.index(0, 0)));
    QCOMPARE(destination.columnCount(destination.index(0, 0)), source.columnCount(source.index(0, 0)));
    for (int i = 0; i < destination.rowCount(destination.index(0, 0)); ++i) {
        for (int j = 0; j < destination.columnCount(destination.index(0, 0)); ++j) {
            QCOMPARE(destination.index(i, j, destination.index(0, 0)).data().toInt(), source.index(i, j, source.index(0, 0)).data().toInt());
            QCOMPARE(destination.index(i, j, destination.index(0, 0)).data(Qt::UserRole).toInt(),
                     source.index(i, j, source.index(0, 0)).data(Qt::UserRole).toInt());
        }
    }
    QCOMPARE(destination.index(0, 0).data().toInt(), source.index(0, 0).data().toInt());
    QCOMPARE(destination.index(0, 0).data(Qt::UserRole).toInt(), source.index(0, 0).data(Qt::UserRole).toInt());
    for (QSignalSpy *spy : rowSpies) {
        QCOMPARE(spy->count(), 1);
        const auto args = spy->takeFirst();
        QVERIFY(!args.at(0).value<QModelIndex>().isValid());
        QCOMPARE(args.at(1).toInt(), 0);
        QCOMPARE(args.at(2).toInt(), 0);
    }
    for (QSignalSpy *spy : columnSpies) {
        QCOMPARE(spy->count(), 1);
        const auto args = spy->takeFirst();
        QVERIFY(!args.at(0).value<QModelIndex>().isValid());
        QCOMPARE(args.at(1).toInt(), 0);
        QCOMPARE(args.at(2).toInt(), 0);
    }
    mimeData->deleteLater();

    mimeData = source.mimeData({parIdx});
    QVERIFY(mimeData);
    QVERIFY(destination.dropMimeData(mimeData, Qt::CopyAction, 0, 0, destination.index(0, 0)));
    QCOMPARE(destination.rowCount(), 1);
    QCOMPARE(destination.columnCount(), 1);
    QCOMPARE(destination.rowCount(destination.index(0, 0)), source.rowCount(source.index(0, 0)) + 1);
    QCOMPARE(destination.columnCount(destination.index(0, 0)), source.columnCount(source.index(0, 0)));
    for (int i = 1; i < destination.rowCount(destination.index(0, 0)); ++i) {
        for (int j = 0; j < destination.columnCount(destination.index(0, 0)); ++j) {
            QCOMPARE(destination.index(i, j, destination.index(0, 0)).data().toInt(), source.index(i - 1, j, source.index(0, 0)).data().toInt());
            QCOMPARE(destination.index(i, j, destination.index(0, 0)).data(Qt::UserRole).toInt(),
                     source.index(i - 1, j, source.index(0, 0)).data(Qt::UserRole).toInt());
        }
    }
    QCOMPARE(destination.rowCount(destination.index(0, 0, destination.index(0, 0))), source.rowCount(parIdx));
    QCOMPARE(destination.columnCount(destination.index(0, 0, destination.index(0, 0))), source.columnCount(parIdx));
    for (int i = 1; i < destination.rowCount(destination.index(0, 0, destination.index(0, 0))); ++i) {
        for (int j = 0; j < destination.columnCount(destination.index(0, 0, destination.index(0, 0))); ++j) {
            QCOMPARE(destination.index(i, j, destination.index(0, 0, destination.index(0, 0))).data().toInt(),
                     source.index(i, j, parIdx).data().toInt());
            QCOMPARE(destination.index(i, j, destination.index(0, 0, destination.index(0, 0))).data(Qt::UserRole).toInt(),
                     source.index(i, j, parIdx).data(Qt::UserRole).toInt());
        }
    }
    for (QSignalSpy *spy : rowSpies) {
        QCOMPARE(spy->count(), 1);
        const auto args = spy->takeFirst();
        QCOMPARE(args.at(0).value<QModelIndex>(), destination.index(0, 0));
        QCOMPARE(args.at(1).toInt(), 0);
        QCOMPARE(args.at(2).toInt(), 0);
    }
    for (QSignalSpy *spy : columnSpies)
        QCOMPARE(spy->count(), 0);
    mimeData->deleteLater();

    mimeData = source.mimeData({source.index(1, 1, parIdx)});
    QVERIFY(mimeData);
    QVERIFY(destination.dropMimeData(mimeData, Qt::CopyAction, 0, 0, QModelIndex()));
    QCOMPARE(destination.rowCount(), 2);
    QCOMPARE(destination.columnCount(), 1);
    QCOMPARE(destination.index(0, 0).data().toInt(), source.index(1, 1, parIdx).data().toInt());
    QCOMPARE(destination.index(0, 0).data(Qt::UserRole).toInt(), source.index(1, 1, parIdx).data(Qt::UserRole).toInt());
    for (QSignalSpy *spy : rowSpies) {
        QCOMPARE(spy->count(), 1);
        const auto args = spy->takeFirst();
        QCOMPARE(args.at(0).value<QModelIndex>(), QModelIndex());
        QCOMPARE(args.at(1).toInt(), 0);
        QCOMPARE(args.at(2).toInt(), 0);
    }
    for (QSignalSpy *spy : columnSpies)
        QCOMPARE(spy->count(), 0);
    mimeData->deleteLater();
}